

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O1

void __thiscall
rlottie::internal::renderer::CompLayer::CompLayer
          (CompLayer *this,Layer *layerModel,VArenaAlloc *allocator)

{
  pointer *pppLVar1;
  unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
  *this_00;
  int iVar2;
  Layer *pLVar3;
  pointer ppOVar4;
  iterator __position;
  pointer ppLVar5;
  pointer ppLVar6;
  VSize VVar7;
  _Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false> __ptr_00;
  VSize *pVVar8;
  Layer *in_RAX;
  Layer **layer;
  pointer ppLVar9;
  _Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false> _Var10;
  VArenaAlloc *unaff_RBX;
  pointer *__ptr;
  pointer ppOVar11;
  pointer ppLVar12;
  pointer ppLVar13;
  long lVar14;
  pointer __p;
  Layer *item;
  Layer *__ptr_01;
  
  Layer::Layer(&this->super_Layer,layerModel);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__CompLayer_001456d8;
  (this->mLayers).
  super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mLayers).
  super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mLayers).
  super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mClipper)._M_t.
  super___uniq_ptr_impl<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
  ._M_t.
  super__Tuple_impl<0UL,_rlottie::internal::renderer::Clipper_*,_std::default_delete<rlottie::internal::renderer::Clipper>_>
  .super__Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false>._M_head_impl =
       (Clipper *)0x0;
  pLVar3 = (this->super_Layer).mLayerData;
  ppOVar11 = (pLVar3->super_Group).mChildren.
             super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppOVar4 = (pLVar3->super_Group).mChildren.
            super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppOVar11 != ppOVar4) {
    std::
    vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
    ::reserve(&this->mLayers,(long)ppOVar4 - (long)ppOVar11 >> 3);
  }
  pLVar3 = (this->super_Layer).mLayerData;
  ppOVar11 = (pLVar3->super_Group).mChildren.
             super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppOVar11 !=
      (pLVar3->super_Group).mChildren.
      super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      in_RAX = (Layer *)createLayerItem(in_RAX,unaff_RBX);
      if (in_RAX != (Layer *)0x0) {
        __position._M_current =
             (this->mLayers).
             super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<rlottie::internal::renderer::Layer*,std::allocator<rlottie::internal::renderer::Layer*>>
          ::_M_realloc_insert<rlottie::internal::renderer::Layer*const&>
                    ((vector<rlottie::internal::renderer::Layer*,std::allocator<rlottie::internal::renderer::Layer*>>
                      *)&this->mLayers,__position,(Layer **)&stack0xffffffffffffffc8);
        }
        else {
          *__position._M_current = (Layer *)in_RAX;
          pppLVar1 = &(this->mLayers).
                      super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppLVar1 = *pppLVar1 + 1;
        }
      }
      ppOVar11 = ppOVar11 + -1;
    } while (ppOVar11 !=
             (((this->super_Layer).mLayerData)->super_Group).mChildren.
             super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  ppLVar9 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar5 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppLVar9 == ppLVar5) {
      VVar7 = layerModel->mLayerSize;
      if (0 < VVar7.mh && 0 < VVar7.mw) {
        this_00 = &this->mClipper;
        _Var10._M_head_impl = (Clipper *)operator_new(0x30);
        (_Var10._M_head_impl)->mSize = VVar7;
        vcow_ptr<VPath::VPathData>::vcow_ptr
                  ((vcow_ptr<VPath::VPathData> *)&(_Var10._M_head_impl)->mPath);
        vcow_ptr<VRle::Data>::vcow_ptr((vcow_ptr<VRle::Data> *)&(_Var10._M_head_impl)->mMaskedRle);
        *(int *)&((_Var10._M_head_impl)->mRasterizer).d.
                 super___shared_ptr<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = 0;
        *(int *)((long)&((_Var10._M_head_impl)->mRasterizer).d.
                        super___shared_ptr<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 4) = 0;
        pVVar8 = (VSize *)((long)&(_Var10._M_head_impl)->mRasterizer + 8);
        pVVar8->mw = 0;
        pVVar8->mh = 0;
        *(undefined1 *)&((VSize *)&(_Var10._M_head_impl)->mRasterRequest)->mw = 0;
        __ptr_01 = (Layer *)0x0;
        __ptr_00._M_head_impl =
             (this_00->_M_t).
             super___uniq_ptr_impl<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
             ._M_t.
             super__Tuple_impl<0UL,_rlottie::internal::renderer::Clipper_*,_std::default_delete<rlottie::internal::renderer::Clipper>_>
             .super__Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false>._M_head_impl;
        (this_00->_M_t).
        super___uniq_ptr_impl<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
        ._M_t.
        super__Tuple_impl<0UL,_rlottie::internal::renderer::Clipper_*,_std::default_delete<rlottie::internal::renderer::Clipper>_>
        .super__Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false>._M_head_impl =
             _Var10._M_head_impl;
        if (__ptr_00._M_head_impl != (Clipper *)0x0) {
          std::default_delete<rlottie::internal::renderer::Clipper>::operator()
                    ((default_delete<rlottie::internal::renderer::Clipper> *)this_00,
                     __ptr_00._M_head_impl);
        }
        if (__ptr_01 != (Layer *)0x0) {
          std::default_delete<rlottie::internal::renderer::Clipper>::operator()
                    ((default_delete<rlottie::internal::renderer::Clipper> *)
                     &stack0xffffffffffffffc8,(Clipper *)__ptr_01);
        }
      }
      if (8 < (ulong)((long)(this->mLayers).
                            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->mLayers).
                           super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        (this->super_Layer).mComplexContent = true;
      }
      return;
    }
    iVar2 = (*ppLVar9)->mLayerData->mParentId;
    if (-1 < iVar2) {
      ppLVar12 = (this->mLayers).
                 super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppLVar6 = (this->mLayers).
                super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar14 = (long)ppLVar6 - (long)ppLVar12 >> 5;
      ppLVar13 = ppLVar12;
      if (0 < lVar14) {
        ppLVar13 = (pointer)(((long)ppLVar6 - (long)ppLVar12 & 0xffffffffffffffe0U) + (long)ppLVar12
                            );
        lVar14 = lVar14 + 1;
        ppLVar12 = ppLVar12 + 2;
        do {
          if (ppLVar12[-2]->mLayerData->mId == iVar2) {
            ppLVar12 = ppLVar12 + -2;
            goto LAB_0012862b;
          }
          if (ppLVar12[-1]->mLayerData->mId == iVar2) {
            ppLVar12 = ppLVar12 + -1;
            goto LAB_0012862b;
          }
          if ((*ppLVar12)->mLayerData->mId == iVar2) goto LAB_0012862b;
          if (ppLVar12[1]->mLayerData->mId == iVar2) {
            ppLVar12 = ppLVar12 + 1;
            goto LAB_0012862b;
          }
          lVar14 = lVar14 + -1;
          ppLVar12 = ppLVar12 + 4;
        } while (1 < lVar14);
      }
      lVar14 = (long)ppLVar6 - (long)ppLVar13 >> 3;
      if (lVar14 == 1) {
LAB_00128607:
        ppLVar12 = ppLVar13;
        if ((*ppLVar13)->mLayerData->mId != iVar2) {
          ppLVar12 = ppLVar6;
        }
      }
      else if (lVar14 == 2) {
LAB_001285f6:
        ppLVar12 = ppLVar13;
        if ((*ppLVar13)->mLayerData->mId != iVar2) {
          ppLVar13 = ppLVar13 + 1;
          goto LAB_00128607;
        }
      }
      else {
        ppLVar12 = ppLVar6;
        if ((lVar14 == 3) && (ppLVar12 = ppLVar13, (*ppLVar13)->mLayerData->mId != iVar2)) {
          ppLVar13 = ppLVar13 + 1;
          goto LAB_001285f6;
        }
      }
LAB_0012862b:
      if (ppLVar12 != ppLVar6) {
        (*ppLVar9)->mParentLayer = *ppLVar12;
      }
    }
    ppLVar9 = ppLVar9 + 1;
  } while( true );
}

Assistant:

renderer::CompLayer::CompLayer(model::Layer *layerModel, VArenaAlloc *allocator)
    : renderer::Layer(layerModel)
{
    if (!mLayerData->mChildren.empty())
        mLayers.reserve(mLayerData->mChildren.size());

    // 1. keep the layer in back-to-front order.
    // as lottie model keeps the data in front-toback-order.
    for (auto it = mLayerData->mChildren.crbegin();
         it != mLayerData->mChildren.rend(); ++it) {
        auto model = static_cast<model::Layer *>(*it);
        auto item = createLayerItem(model, allocator);
        if (item) mLayers.push_back(item);
    }

    // 2. update parent layer
    for (const auto &layer : mLayers) {
        int id = layer->parentId();
        if (id >= 0) {
            auto search =
                std::find_if(mLayers.begin(), mLayers.end(),
                             [id](const auto &val) { return val->id() == id; });
            if (search != mLayers.end()) layer->setParentLayer(*search);
        }
    }

    // 4. check if its a nested composition
    if (!layerModel->layerSize().empty()) {
        mClipper = std::make_unique<renderer::Clipper>(layerModel->layerSize());
    }

    if (mLayers.size() > 1) setComplexContent(true);
}